

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::write_escaped_cp<fmt::v11::basic_appender<char>,char>
          (basic_appender<char> out,find_escape_result<char> *escape)

{
  byte *pbVar1;
  size_t sVar2;
  char *pcVar3;
  basic_appender<char> bVar4;
  uint cp;
  ulong uVar5;
  byte *pbVar6;
  
  cp = escape->cp;
  if ((int)cp < 0x22) {
    if (cp == 9) {
      sVar2 = (out.container)->size_;
      uVar5 = sVar2 + 1;
      if ((out.container)->capacity_ < uVar5) {
        (*(out.container)->grow_)(out.container,uVar5);
        sVar2 = (out.container)->size_;
        uVar5 = sVar2 + 1;
      }
      (out.container)->size_ = uVar5;
      pcVar3 = (out.container)->ptr_ + sVar2;
      cp = 0x74;
    }
    else if (cp == 10) {
      sVar2 = (out.container)->size_;
      uVar5 = sVar2 + 1;
      if ((out.container)->capacity_ < uVar5) {
        (*(out.container)->grow_)(out.container,uVar5);
        sVar2 = (out.container)->size_;
        uVar5 = sVar2 + 1;
      }
      (out.container)->size_ = uVar5;
      pcVar3 = (out.container)->ptr_ + sVar2;
      cp = 0x6e;
    }
    else {
      if (cp != 0xd) goto LAB_003a83d5;
      sVar2 = (out.container)->size_;
      uVar5 = sVar2 + 1;
      if ((out.container)->capacity_ < uVar5) {
        (*(out.container)->grow_)(out.container,uVar5);
        sVar2 = (out.container)->size_;
        uVar5 = sVar2 + 1;
      }
      (out.container)->size_ = uVar5;
      pcVar3 = (out.container)->ptr_ + sVar2;
      cp = 0x72;
    }
  }
  else {
    if (((cp != 0x22) && (cp != 0x27)) && (cp != 0x5c)) {
LAB_003a83d5:
      if (cp < 0x100) {
        bVar4 = write_codepoint<2ul,char,fmt::v11::basic_appender<char>>(out,'x',cp);
        return (basic_appender<char>)bVar4.container;
      }
      if (0xffff < cp) {
        if (0x10ffff < cp) {
          pbVar1 = (byte *)escape->end;
          for (pbVar6 = (byte *)escape->begin; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
            out = write_codepoint<2ul,char,fmt::v11::basic_appender<char>>(out,'x',(uint)*pbVar6);
          }
          return (basic_appender<char>)out.container;
        }
        bVar4 = write_codepoint<8ul,char,fmt::v11::basic_appender<char>>(out,'U',cp);
        return (basic_appender<char>)bVar4.container;
      }
      bVar4 = write_codepoint<4ul,char,fmt::v11::basic_appender<char>>(out,'u',cp);
      return (basic_appender<char>)bVar4.container;
    }
    sVar2 = (out.container)->size_;
    uVar5 = sVar2 + 1;
    if ((out.container)->capacity_ < uVar5) {
      (*(out.container)->grow_)(out.container,uVar5);
      sVar2 = (out.container)->size_;
      uVar5 = sVar2 + 1;
    }
    (out.container)->size_ = uVar5;
    pcVar3 = (out.container)->ptr_ + sVar2;
  }
  *pcVar3 = '\\';
  sVar2 = (out.container)->size_;
  uVar5 = sVar2 + 1;
  if ((out.container)->capacity_ < uVar5) {
    (*(out.container)->grow_)(out.container,uVar5);
    sVar2 = (out.container)->size_;
    uVar5 = sVar2 + 1;
  }
  (out.container)->size_ = uVar5;
  (out.container)->ptr_[sVar2] = (char)cp;
  return (basic_appender<char>)out.container;
}

Assistant:

auto write_escaped_cp(OutputIt out, const find_escape_result<Char>& escape)
    -> OutputIt {
  auto c = static_cast<Char>(escape.cp);
  switch (escape.cp) {
  case '\n':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('n');
    break;
  case '\r':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('r');
    break;
  case '\t':
    *out++ = static_cast<Char>('\\');
    c = static_cast<Char>('t');
    break;
  case '"':  FMT_FALLTHROUGH;
  case '\'': FMT_FALLTHROUGH;
  case '\\': *out++ = static_cast<Char>('\\'); break;
  default:
    if (escape.cp < 0x100) return write_codepoint<2, Char>(out, 'x', escape.cp);
    if (escape.cp < 0x10000)
      return write_codepoint<4, Char>(out, 'u', escape.cp);
    if (escape.cp < 0x110000)
      return write_codepoint<8, Char>(out, 'U', escape.cp);
    for (Char escape_char : basic_string_view<Char>(
             escape.begin, to_unsigned(escape.end - escape.begin))) {
      out = write_codepoint<2, Char>(out, 'x',
                                     static_cast<uint32_t>(escape_char) & 0xFF);
    }
    return out;
  }
  *out++ = c;
  return out;
}